

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_extendnode(MDD mdd,uint32_t value,MDD ifeq)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  MDD MVar4;
  long lVar5;
  
  if (1 < mdd) {
    lVar5 = mdd * 0x10;
    puVar2 = nodes->data;
    uVar3 = *(ulong *)(puVar2 + lVar5 + 8);
    if (((uint)uVar3 >> 0x10 & 1) != 0) {
      MVar4 = lddmc_extendnode(*(ulong *)(puVar2 + lVar5) >> 1 & 0x7fffffffffff,value,ifeq);
      MVar4 = lddmc_make_copynode(uVar3 >> 0x11,MVar4);
      return MVar4;
    }
    uVar1 = *(uint *)(puVar2 + lVar5 + 6);
    if (uVar1 < value) {
      mdd = lddmc_extendnode(*(ulong *)(puVar2 + lVar5) >> 1 & 0x7fffffffffff,value,ifeq);
      ifeq = uVar3 >> 0x11;
      value = uVar1;
    }
    else if (uVar1 == value) {
      mdd = *(ulong *)(puVar2 + lVar5) >> 1 & 0x7fffffffffff;
    }
  }
  MVar4 = lddmc_makenode(value,ifeq,mdd);
  return MVar4;
}

Assistant:

MDD
lddmc_extendnode(MDD mdd, uint32_t value, MDD ifeq)
{
    if (mdd <= lddmc_true) return lddmc_makenode(value, ifeq, mdd);

    mddnode_t n = LDD_GETNODE(mdd);
    if (mddnode_getcopy(n)) return lddmc_make_copynode(mddnode_getdown(n), lddmc_extendnode(mddnode_getright(n), value, ifeq));
    uint32_t n_value = mddnode_getvalue(n);
    if (n_value < value) return lddmc_makenode(n_value, mddnode_getdown(n), lddmc_extendnode(mddnode_getright(n), value, ifeq));
    if (n_value == value) return lddmc_makenode(value, ifeq, mddnode_getright(n));
    /* (n_value > value) */ return lddmc_makenode(value, ifeq, mdd);
}